

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

vw * parse_args(options_i *options,trace_message_t trace_listener,void *trace_context)

{
  byte bVar1;
  int iVar2;
  vw *this;
  typed_option<unsigned_long> *ptVar3;
  parser *this_00;
  option_group_definition *poVar4;
  typed_option<int> *op;
  AllReduceSockets *this_01;
  vw_exception *this_02;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  allocator local_a3a;
  allocator local_a39;
  allocator local_a38;
  allocator local_a37;
  allocator local_a36;
  allocator local_a35;
  allocator local_a34;
  allocator local_a33;
  allocator local_a32;
  allocator local_a31;
  int span_server_port_arg;
  allocator local_a2c;
  allocator local_a2b;
  allocator local_a2a;
  allocator local_a29;
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [32];
  allocator local_9c8 [32];
  allocator local_9a8 [32];
  size_t ring_size;
  size_t node_arg;
  size_t total_arg;
  size_t unique_id_arg;
  option_group_definition weight_args;
  undefined1 local_8e8 [160];
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  undefined1 local_628 [160];
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  undefined1 local_4c8 [160];
  undefined1 local_428 [160];
  stringstream __msg;
  undefined1 local_378 [64];
  string local_338 [312];
  string local_200;
  option_group_definition update_args;
  option_group_definition vw_args;
  string span_server_arg;
  string local_140 [112];
  option_group_definition parallelization_args;
  
  this = (vw *)operator_new(0x3658);
  vw::vw(this);
  this->options = options;
  if (trace_listener != (trace_message_t)0x0) {
    *(trace_message_t *)&(this->trace_message).super_ostream.field_0x80 = trace_listener;
    *(void **)&(this->trace_message).super_ostream.field_0x78 = trace_context;
  }
  time(&this->init_time);
  std::__cxx11::string::string((string *)&local_4e8,"VW options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&vw_args,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_508,"ring_size",(allocator *)local_4c8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_508,&ring_size);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)&__msg,0x100);
  std::__cxx11::string::string((string *)local_8e8,"size of example ring",(allocator *)local_628);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&vw_args,ptVar3);
  std::__cxx11::string::~string((string *)local_8e8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_508);
  (**options->_vptr_options_i)(options,&vw_args);
  this_00 = (parser *)operator_new(0x398);
  parser::parser(this_00,ring_size);
  this->p = this_00;
  std::__cxx11::string::string((string *)&local_528,"Update options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&update_args,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string((string *)&local_548,"learning_rate",local_9a8);
  VW::config::typed_option<float>::typed_option((typed_option<float> *)&__msg,&local_548,&this->eta)
  ;
  std::__cxx11::string::string((string *)&parallelization_args,"Set learning rate",local_9c8);
  std::__cxx11::string::_M_assign((string *)(local_378 + 0x20));
  std::__cxx11::string::string((string *)&span_server_arg,"l",(allocator *)&unique_id_arg);
  std::__cxx11::string::_M_assign(local_338);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (&update_args,(typed_option<float> *)&__msg);
  std::__cxx11::string::string((string *)&local_568,"power_t",(allocator *)&total_arg);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_8e8,&local_568,&this->power_t);
  std::__cxx11::string::string((string *)&weight_args,"t power value",(allocator *)&node_arg);
  std::__cxx11::string::_M_assign((string *)(local_8e8 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_8e8);
  std::__cxx11::string::string
            ((string *)&local_588,"decay_learning_rate",(allocator *)&span_server_port_arg);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_4c8,&local_588,&this->eta_decay_rate);
  std::__cxx11::string::string
            (local_a28,"Set Decay factor for learning_rate between passes",&local_a39);
  std::__cxx11::string::_M_assign((string *)(local_4c8 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_4c8);
  std::__cxx11::string::string((string *)&local_648,"initial_t",&local_a3a);
  VW::config::typed_option<double>::typed_option
            ((typed_option<double> *)local_628,&local_648,&this->sd->t);
  std::__cxx11::string::string(local_9e8,"initial t value",&local_a36);
  std::__cxx11::string::_M_assign((string *)(local_628 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<double>&>
                     (poVar4,(typed_option<double> *)local_628);
  std::__cxx11::string::string((string *)&local_668,"feature_mask",&local_a37);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_428,&local_668,&this->feature_mask);
  std::__cxx11::string::string
            (local_a08,
             "Use existing regressor to determine which parameters may be updated.  If no initial_regressor given, also used for initial weights."
             ,&local_a38);
  std::__cxx11::string::_M_assign((string *)(local_428 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar4,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_428);
  std::__cxx11::string::~string(local_a08);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_428);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string(local_9e8);
  VW::config::typed_option<double>::~typed_option((typed_option<double> *)local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string(local_a28);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_4c8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&weight_args);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_8e8);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&span_server_arg);
  std::__cxx11::string::~string((string *)&parallelization_args);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_548);
  (**options->_vptr_options_i)(options,&update_args);
  std::__cxx11::string::string((string *)&local_688,"Weight options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&weight_args,&local_688);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::string
            ((string *)&local_6a8,"initial_regressor",(allocator *)&span_server_port_arg);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__msg,&local_6a8,&this->initial_regressors);
  std::__cxx11::string::string(local_a28,"Initial regressor(s)",&local_a39);
  std::__cxx11::string::_M_assign((string *)(local_378 + 0x20));
  std::__cxx11::string::string(local_9e8,"i",&local_a3a);
  std::__cxx11::string::_M_assign(local_338);
  poVar4 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (&weight_args,
                      (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&__msg);
  std::__cxx11::string::string((string *)&local_6c8,"initial_weight",&local_a36);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_8e8,&local_6c8,&this->initial_weight);
  std::__cxx11::string::string(local_a08,"Set all weights to an initial value of arg.",&local_a37);
  std::__cxx11::string::_M_assign((string *)(local_8e8 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_8e8);
  std::__cxx11::string::string((string *)&local_6e8,"random_weights",&local_a38);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4c8,&local_6e8,&this->random_weights);
  std::__cxx11::string::string((string *)local_9a8,"make initial weights random",&local_a31);
  std::__cxx11::string::_M_assign((string *)(local_4c8 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_4c8);
  std::__cxx11::string::string((string *)&local_708,"normal_weights",&local_a32);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_628,&local_708,&this->normal_weights);
  std::__cxx11::string::string((string *)local_9c8,"make initial weights normal",&local_a33);
  std::__cxx11::string::_M_assign((string *)(local_628 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_628);
  std::__cxx11::string::string((string *)&local_728,"truncated_normal_weights",&local_a34);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_428,&local_728,&this->tnormal_weights);
  std::__cxx11::string::string
            ((string *)&unique_id_arg,"make initial weights truncated normal",&local_a35);
  std::__cxx11::string::_M_assign((string *)(local_428 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_428);
  std::__cxx11::string::string((string *)&local_748,"sparse_weights",&local_a29);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&parallelization_args,&local_748,&(this->weights).sparse);
  std::__cxx11::string::string
            ((string *)&total_arg,"Use a sparse datastructure for weights",&local_a2a);
  std::__cxx11::string::_M_assign
            ((string *)
             &parallelization_args.m_options.
              super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)&parallelization_args);
  std::__cxx11::string::string((string *)&local_768,"input_feature_regularizer",&local_a2b);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&span_server_arg,&local_768,&this->per_feature_regularizer_input);
  std::__cxx11::string::string
            ((string *)&node_arg,"Per feature regularization input file",&local_a2c);
  std::__cxx11::string::_M_assign(local_140);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar4,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&span_server_arg);
  std::__cxx11::string::~string((string *)&node_arg);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&span_server_arg);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&total_arg);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&parallelization_args);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&unique_id_arg);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_428);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)local_9c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_628);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)local_9a8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_4c8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string(local_a08);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_8e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string(local_9e8);
  std::__cxx11::string::~string(local_a28);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__msg);
  std::__cxx11::string::~string((string *)&local_6a8);
  (**options->_vptr_options_i)(options,&weight_args);
  span_server_arg._M_dataplus._M_p = (pointer)&span_server_arg.field_2;
  span_server_arg._M_string_length = 0;
  span_server_arg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_788,"Parallelization options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&parallelization_args,&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::string((string *)&local_7a8,"span_server",&local_a39);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_7a8,&span_server_arg);
  std::__cxx11::string::string
            (local_a28,"Location of server for setting up spanning tree",&local_a3a);
  std::__cxx11::string::_M_assign((string *)(local_378 + 0x20));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&parallelization_args,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&__msg);
  std::__cxx11::string::string((string *)&local_7c8,"unique_id",&local_a36);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_8e8,&local_7c8,&unique_id_arg);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_8e8,0);
  std::__cxx11::string::string(local_9e8,"unique id used for cluster parallel jobs",&local_a37);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,ptVar3);
  std::__cxx11::string::string((string *)&local_7e8,"total",&local_a38);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_4c8,&local_7e8,&total_arg);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_4c8,1);
  std::__cxx11::string::string
            (local_a08,"total number of nodes used in cluster parallel job",&local_a31);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,ptVar3);
  std::__cxx11::string::string((string *)&local_808,"node",&local_a32);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_628,&local_808,&node_arg);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_628,0);
  std::__cxx11::string::string((string *)local_9a8,"node number in cluster parallel job",&local_a33)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,ptVar3);
  std::__cxx11::string::string((string *)&local_828,"span_server_port",&local_a34);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)local_428,&local_828,&span_server_port_arg);
  op = VW::config::typed_option<int>::default_value((typed_option<int> *)local_428,0x67af);
  std::__cxx11::string::string
            ((string *)local_9c8,"Port of the server for setting up spanning tree",&local_a35);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar4,op);
  std::__cxx11::string::~string((string *)local_9c8);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)local_428);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)local_9a8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_628);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string(local_a08);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_4c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string(local_9e8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_8e8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string(local_a28);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_7a8);
  (**options->_vptr_options_i)(options,&parallelization_args);
  std::__cxx11::string::string((string *)&__msg,"total",(allocator *)local_9e8);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  bVar1 = (byte)iVar2;
  if (bVar1 == 0) {
    std::__cxx11::string::string((string *)local_8e8,"node",(allocator *)local_a08);
    iVar2 = (*options->_vptr_options_i[1])(options,local_8e8);
    if ((char)iVar2 != '\0') goto LAB_00128667;
    std::__cxx11::string::string((string *)local_4c8,"unique_id",local_9a8);
    iVar2 = (*options->_vptr_options_i[1])(options,local_4c8);
    bVar6 = 1;
    bVar5 = bVar6;
    if ((char)iVar2 != '\0') goto LAB_0012866a;
    bVar7 = 0;
LAB_00128771:
    std::__cxx11::string::~string((string *)local_4c8);
    if (bVar6 == 0) goto LAB_00128790;
  }
  else {
LAB_00128667:
    bVar5 = 0;
LAB_0012866a:
    bVar6 = bVar1 ^ 1;
    std::__cxx11::string::string((string *)local_628,"total",local_9c8);
    iVar2 = (*options->_vptr_options_i[1])(options,local_628);
    bVar7 = 1;
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string((string *)local_428,"node",&local_a39);
      iVar2 = (*options->_vptr_options_i[1])(options,local_428);
      bVar7 = 1;
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string(local_a28,"unique_id",&local_a3a);
        iVar2 = (*options->_vptr_options_i[1])(options,local_a28);
        bVar7 = (byte)iVar2 ^ 1;
        std::__cxx11::string::~string(local_a28);
      }
      std::__cxx11::string::~string((string *)local_428);
    }
    std::__cxx11::string::~string((string *)local_628);
    if (bVar5 != 0) goto LAB_00128771;
    if (bVar1 != 0) goto LAB_00128790;
  }
  std::__cxx11::string::~string((string *)local_8e8);
LAB_00128790:
  std::__cxx11::string::~string((string *)&__msg);
  if (bVar7 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<((ostream *)local_378,
                    "you must specificy unique_id, total, and node if you specify any");
    this_02 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_02,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
               ,0x54e,&local_200);
    __cxa_throw(this_02,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::string::string((string *)&__msg,"span_server",(allocator *)local_628);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar2 != '\0') {
    this->all_reduce_type = Socket;
    this_01 = (AllReduceSockets *)operator_new(0x78);
    std::__cxx11::string::string((string *)&local_848,(string *)&span_server_arg);
    AllReduceSockets::AllReduceSockets
              (this_01,&local_848,span_server_port_arg,unique_id_arg,total_arg,node_arg);
    this->all_reduce = (AllReduce *)this_01;
    std::__cxx11::string::~string((string *)&local_848);
  }
  parse_diagnostics(options,this);
  this->initial_t = (float)this->sd->t;
  VW::config::option_group_definition::~option_group_definition(&parallelization_args);
  std::__cxx11::string::~string((string *)&span_server_arg);
  VW::config::option_group_definition::~option_group_definition(&weight_args);
  VW::config::option_group_definition::~option_group_definition(&update_args);
  VW::config::option_group_definition::~option_group_definition(&vw_args);
  return this;
}

Assistant:

vw& parse_args(options_i& options, trace_message_t trace_listener, void* trace_context)
{
  vw& all = *(new vw());
  all.options = &options;

  if (trace_listener)
  {
    all.trace_message.trace_listener = trace_listener;
    all.trace_message.trace_context = trace_context;
  }

  try
  {
    time(&all.init_time);

    size_t ring_size;
    option_group_definition vw_args("VW options");
    vw_args.add(make_option("ring_size", ring_size).default_value(256).help("size of example ring"));
    options.add_and_parse(vw_args);

    all.p = new parser{ring_size};

    option_group_definition update_args("Update options");
    update_args.add(make_option("learning_rate", all.eta).help("Set learning rate").short_name("l"))
        .add(make_option("power_t", all.power_t).help("t power value"))
        .add(make_option("decay_learning_rate", all.eta_decay_rate)
                 .help("Set Decay factor for learning_rate between passes"))
        .add(make_option("initial_t", all.sd->t).help("initial t value"))
        .add(make_option("feature_mask", all.feature_mask)
                 .help("Use existing regressor to determine which parameters may be updated.  If no initial_regressor "
                       "given, also used for initial weights."));
    options.add_and_parse(update_args);

    option_group_definition weight_args("Weight options");
    weight_args
        .add(make_option("initial_regressor", all.initial_regressors).help("Initial regressor(s)").short_name("i"))
        .add(make_option("initial_weight", all.initial_weight).help("Set all weights to an initial value of arg."))
        .add(make_option("random_weights", all.random_weights).help("make initial weights random"))
        .add(make_option("normal_weights", all.normal_weights).help("make initial weights normal"))
        .add(make_option("truncated_normal_weights", all.tnormal_weights).help("make initial weights truncated normal"))
        .add(make_option("sparse_weights", all.weights.sparse).help("Use a sparse datastructure for weights"))
        .add(make_option("input_feature_regularizer", all.per_feature_regularizer_input)
                 .help("Per feature regularization input file"));
    options.add_and_parse(weight_args);

    std::string span_server_arg;
    int span_server_port_arg;
    // bool threads_arg;
    size_t unique_id_arg;
    size_t total_arg;
    size_t node_arg;
    option_group_definition parallelization_args("Parallelization options");
    parallelization_args
        .add(make_option("span_server", span_server_arg).help("Location of server for setting up spanning tree"))
        //(make_option("threads", threads_arg).help("Enable multi-threading")) Unused option?
        .add(make_option("unique_id", unique_id_arg).default_value(0).help("unique id used for cluster parallel jobs"))
        .add(
            make_option("total", total_arg).default_value(1).help("total number of nodes used in cluster parallel job"))
        .add(make_option("node", node_arg).default_value(0).help("node number in cluster parallel job"))
        .add(make_option("span_server_port", span_server_port_arg).default_value(26543)
          .help("Port of the server for setting up spanning tree"));
    options.add_and_parse(parallelization_args);

    // total, unique_id and node must be specified together.
    if ((options.was_supplied("total") || options.was_supplied("node") || options.was_supplied("unique_id")) &&
        !(options.was_supplied("total") && options.was_supplied("node") && options.was_supplied("unique_id")))
    {
      THROW("you must specificy unique_id, total, and node if you specify any");
    }

    if (options.was_supplied("span_server"))
    {
      all.all_reduce_type = AllReduceType::Socket;
      all.all_reduce = new AllReduceSockets(span_server_arg, span_server_port_arg, unique_id_arg, total_arg, node_arg);
    }

    parse_diagnostics(options, all);

    all.initial_t = (float)all.sd->t;
    return all;
  }
  catch (...)
  {
    VW::finish(all);
    throw;
  }
}